

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCutGeneration.cpp
# Opt level: O1

bool __thiscall
HighsCutGeneration::cmirCutGenerationHeuristic
          (HighsCutGeneration *this,double minEfficacy,bool onlyInitialCMIRScale)

{
  vector<double,_std::allocator<double>_> *this_00;
  int iVar1;
  pointer pdVar2;
  pointer piVar3;
  iterator __position;
  iterator iVar4;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last;
  double *pdVar5;
  int *piVar6;
  int *piVar7;
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var14;
  pointer pdVar15;
  int *piVar16;
  int *piVar17;
  ulong uVar18;
  HighsCDouble *__args;
  ulong uVar19;
  long lVar20;
  uint uVar21;
  double *pdVar22;
  uint uVar23;
  undefined4 in_XMM0_Dc;
  undefined4 extraout_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined4 extraout_XMM0_Dd;
  double dVar24;
  double dVar25;
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  double dVar33;
  double dVar34;
  HighsCDouble HVar35;
  double delta;
  double local_d0;
  undefined1 local_c8 [16];
  ulong uStack_b0;
  double local_a8;
  HighsCDouble local_98;
  undefined1 local_88 [16];
  double local_78;
  undefined8 uStack_70;
  HighsCDouble local_68;
  HighsCDouble local_58;
  undefined1 local_48 [16];
  
  auVar8._8_4_ = in_XMM0_Dc;
  auVar8._0_8_ = minEfficacy;
  auVar8._12_4_ = in_XMM0_Dd;
  this->integralSupport = false;
  this->integralCoefficients = false;
  this_00 = &this->deltas;
  pdVar2 = (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar2) {
    (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar2;
  }
  std::vector<double,_std::allocator<double>_>::reserve(this_00,(long)this->rowlen + 3);
  piVar3 = (this->integerinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->integerinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar3) {
    (this->integerinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar3;
  }
  std::vector<int,_std::allocator<int>_>::reserve(&this->integerinds,(long)this->rowlen);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->complementation,(long)this->rowlen);
  local_68.hi = (double)((ulong)local_68.hi._4_4_ << 0x20);
  local_c8._0_8_ = 0.0;
  local_d0 = 0.0;
  local_a8 = 0.0;
  if (this->rowlen != 0) {
    iVar13 = 0;
    local_a8 = 0.0;
    local_d0 = 0.0;
    local_c8._0_8_ = 0.0;
    do {
      if ((this->isintegral).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start[iVar13] == '\0') {
        dVar24 = this->vals[iVar13];
        dVar34 = (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar13];
        local_a8 = local_a8 + dVar24 * dVar34;
        if (((dVar24 <= 0.0) || (this->feastol < dVar34)) &&
           ((0.0 <= dVar24 ||
            (dVar34 < (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar13] - this->feastol)))) {
          local_d0 = local_d0 + dVar24 * dVar24;
        }
      }
      else {
        __position._M_current =
             (this->integerinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->integerinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&this->integerinds,__position,
                     (int *)&local_68);
        }
        else {
          *__position._M_current = iVar13;
          (this->integerinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        dVar24 = (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[local_68.hi._0_4_];
        dVar24 = dVar24 + dVar24;
        pdVar22 = (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + local_68.hi._0_4_;
        if (*pdVar22 <= dVar24 && dVar24 != *pdVar22) {
          flipComplementation(this,local_68.hi._0_4_);
        }
        if (!onlyInitialCMIRScale) {
          dVar24 = (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[local_68.hi._0_4_];
          if ((this->feastol <= dVar24 && dVar24 != this->feastol) &&
             (local_98.hi = ABS(this->vals[local_68.hi._0_4_]), 0.0001 < local_98.hi)) {
            if ((local_98.hi != (double)local_c8._0_8_) ||
               (NAN(local_98.hi) || NAN((double)local_c8._0_8_))) {
              dVar24 = local_98.hi;
              if (local_98.hi <= (double)local_c8._0_8_) {
                dVar24 = (double)local_c8._0_8_;
              }
              local_c8._0_8_ = dVar24;
              iVar4._M_current =
                   (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar4._M_current ==
                  (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                          ((vector<double,std::allocator<double>> *)this_00,iVar4,&local_98.hi);
              }
              else {
                *iVar4._M_current = local_98.hi;
                (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar4._M_current + 1;
              }
            }
          }
        }
      }
      iVar13 = local_68.hi._0_4_ + 1;
      local_68.hi = (double)CONCAT44(local_68.hi._4_4_,iVar13);
    } while (iVar13 != this->rowlen);
  }
  if ((local_d0 == 0.0) && (!NAN(local_d0))) {
    pdVar22 = (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar19 = (long)(this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pdVar22;
    if (8 < uVar19) {
      local_98.hi = HighsIntegers::integralScale
                              (pdVar22,(HighsInt)(uVar19 >> 3),this->feastol,1e-14);
      if (((local_98.hi != 0.0) || (NAN(local_98.hi))) && (local_98.hi <= 10000.0)) {
        dVar24 = ((this->rhs).hi + (this->rhs).lo) * local_98.hi;
        dVar24 = dVar24 - (double)(long)((long)dVar24 - (ulong)(dVar24 < (double)(long)dVar24));
        if ((0.005 <= dVar24) && (dVar24 <= 0.995)) {
          local_98.hi = 1.0 / local_98.hi;
          iVar4._M_current =
               (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (this_00,iVar4,&local_98.hi);
          }
          else {
            *iVar4._M_current = local_98.hi;
            (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar4._M_current + 1;
          }
        }
      }
    }
  }
  local_98.hi = 1.0;
  __args = (HighsCDouble *)&this->initialScale;
  if (1.0 < this->initialScale || this->initialScale == 1.0) {
    __args = &local_98;
  }
  iVar4._M_current =
       (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)this_00,iVar4,&__args->hi);
  }
  else {
    *iVar4._M_current = __args->hi;
    (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current + 1;
  }
  if (!onlyInitialCMIRScale) {
    dVar24 = this->initialScale;
    uVar30 = SUB84(dVar24,0);
    uVar32 = (undefined4)((ulong)dVar24 >> 0x20);
    if (1.0 <= dVar24) {
      uVar30 = 0;
      uVar32 = 0x3ff00000;
    }
    local_98.hi = (double)local_c8._0_8_ + (double)CONCAT44(uVar32,uVar30);
    iVar4._M_current =
         (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (this_00,iVar4,&local_98.hi);
    }
    else {
      *iVar4._M_current = local_98.hi;
      (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current + 1;
    }
  }
  pdVar2 = (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar15 = (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar21 = 0;
  if (pdVar2 != pdVar15) {
    uVar19 = (long)pdVar15 - (long)pdVar2 >> 3;
    if (1 < uVar19) {
      uVar21 = 0;
      do {
        uVar19 = (long)uVar19 >> 1;
        uVar21 = uVar21 + 1;
      } while (1 < uVar19);
    }
    pdqsort_detail::
    pdqsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::less<double>,true>
              (pdVar2,pdVar15,uVar21,1);
    _Var14._M_current =
         (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
    __last._M_current =
         (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    uVar19 = (long)__last._M_current - (long)_Var14._M_current >> 3;
    if (1 < uVar19) {
      dVar24 = *_Var14._M_current;
      uVar18 = 1;
      do {
        dVar34 = _Var14._M_current[uVar18];
        uVar30 = SUB84(dVar34,0);
        uVar32 = (undefined4)((ulong)dVar34 >> 0x20);
        if (dVar34 - dVar24 <= this->feastol * 10.0) {
          _Var14._M_current[uVar18] = 0.0;
          uVar30 = SUB84(dVar24,0);
          uVar32 = (undefined4)((ulong)dVar24 >> 0x20);
        }
        uVar18 = uVar18 + 1;
        dVar24 = (double)CONCAT44(uVar32,uVar30);
      } while (uVar19 != uVar18);
    }
    local_98.hi = 0.0;
    _Var14 = std::
             __remove_if<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_equals_val<double_const>>
                       (_Var14,__last,(_Iter_equals_val<const_double>)&local_98);
    pdVar22 = (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((_Var14._M_current != pdVar22) &&
       (pdVar2 = (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish,
       pdVar15 = (pointer)((long)_Var14._M_current + ((long)pdVar2 - (long)pdVar22)),
       pdVar2 != pdVar15)) {
      (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = pdVar15;
    }
    pdVar22 = (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar5 = (this->deltas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uStack_b0 = auVar8._8_8_;
    if (pdVar22 == pdVar5) {
      local_c8 = ZEXT816(0xbff0000000000000);
    }
    else {
      local_c8 = ZEXT816(0xbff0000000000000);
      do {
        dVar24 = *pdVar22;
        dVar25 = 1.0 / dVar24;
        dVar34 = ((this->rhs).hi + (this->rhs).lo) * dVar25;
        dVar33 = (double)(long)((long)dVar34 - (ulong)(dVar34 < (double)(long)dVar34));
        dVar34 = dVar34 - dVar33;
        if (((0.005 <= dVar34) && (dVar34 <= 0.995)) &&
           (dVar10 = 1.0 / (1.0 - dVar34), dVar10 <= 1000000.0)) {
          dVar9 = dVar25 * dVar25 * local_d0;
          dVar33 = local_a8 * dVar25 * dVar10 - dVar33;
          piVar16 = (this->integerinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar6 = (this->integerinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if (piVar16 != piVar6) {
            do {
              iVar13 = *piVar16;
              dVar10 = this->vals[iVar13] * dVar25;
              dVar26 = dVar10 + 1e-14;
              lVar20 = (long)dVar26;
              dVar26 = (double)(long)(lVar20 - (ulong)(dVar26 < (double)lVar20));
              dVar10 = (dVar10 - dVar26) - dVar34;
              if (dVar10 <= 0.0) {
                dVar10 = 0.0;
              }
              dVar10 = dVar10 + dVar26;
              dVar26 = (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar13];
              if (((dVar10 <= 0.0) || (this->feastol < dVar26)) &&
                 ((0.0 <= dVar10 ||
                  (dVar26 < (this->upper).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[iVar13] - this->feastol)))) {
                dVar9 = dVar9 + dVar10 * dVar10;
              }
              dVar33 = dVar33 + dVar10 * dVar26;
              piVar16 = piVar16 + 1;
            } while (piVar16 != piVar6);
          }
          if (dVar9 < 0.0) {
            local_88._8_8_ = 0;
            local_88._0_8_ = dVar24;
            local_78 = dVar33;
            dVar9 = sqrt(dVar9);
            uVar30 = local_88._0_4_;
            uVar32 = local_88._4_4_;
            uVar29 = local_88._8_4_;
            uVar31 = local_88._12_4_;
            dVar33 = local_78;
          }
          else {
            dVar9 = SQRT(dVar9);
            uVar30 = SUB84(dVar24,0);
            uVar32 = (int)((ulong)dVar24 >> 0x20);
            uVar29 = 0;
            uVar31 = 0;
          }
          dVar33 = dVar33 / dVar9;
          dVar24 = dVar33;
          if (dVar33 <= minEfficacy) {
            dVar24 = minEfficacy;
          }
          uVar19 = CONCAT44(uVar31,uVar29) & uStack_b0;
          auVar27._0_8_ = ~-(ulong)(minEfficacy < dVar33) & local_c8._0_8_;
          auVar27._8_8_ = ~uStack_b0 & local_c8._8_8_;
          auVar11._8_4_ = (int)uVar19;
          auVar11._0_8_ = CONCAT44(uVar32,uVar30) & -(ulong)(minEfficacy < dVar33);
          auVar11._12_4_ = (int)(uVar19 >> 0x20);
          local_c8 = auVar27 | auVar11;
          uStack_b0 = 0;
          minEfficacy = dVar24;
        }
        pdVar22 = pdVar22 + 1;
      } while (pdVar22 != pdVar5);
    }
    uVar21 = -(uint)((double)local_c8._0_8_ != -1.0) & 1;
    if (((double)local_c8._0_8_ != -1.0) || (NAN((double)local_c8._0_8_))) {
      if (!onlyInitialCMIRScale) {
        uVar23 = 1;
        do {
          uVar30 = 0;
          uVar32 = 0;
          dVar33 = (double)(1 << ((byte)uVar23 & 0x1f)) * (double)local_c8._0_8_;
          dVar25 = 1.0 / dVar33;
          dVar24 = ((this->rhs).hi + (this->rhs).lo) * dVar25;
          dVar34 = (double)(long)((long)dVar24 - (ulong)(dVar24 < (double)(long)dVar24));
          dVar24 = dVar24 - dVar34;
          if (((0.005 <= dVar24) && (dVar24 <= 0.995)) &&
             (dVar10 = 1.0 / (1.0 - dVar24), dVar10 <= 1000000.0)) {
            dVar9 = dVar25 * dVar25 * local_d0;
            dVar34 = local_a8 * dVar25 * dVar10 - dVar34;
            piVar16 = (this->integerinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar6 = (this->integerinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            if (piVar16 != piVar6) {
              do {
                iVar13 = *piVar16;
                dVar10 = this->vals[iVar13] * dVar25;
                dVar26 = dVar10 + 1e-14;
                lVar20 = (long)dVar26;
                dVar26 = (double)(long)(lVar20 - (ulong)(dVar26 < (double)lVar20));
                dVar10 = (dVar10 - dVar26) - dVar24;
                if (dVar10 <= 0.0) {
                  dVar10 = 0.0;
                }
                dVar10 = dVar10 + dVar26;
                dVar26 = (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar13];
                if (((dVar10 <= 0.0) || (this->feastol < dVar26)) &&
                   ((0.0 <= dVar10 ||
                    (dVar26 < (this->upper).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start[iVar13] - this->feastol)))) {
                  dVar9 = dVar9 + dVar10 * dVar10;
                }
                dVar34 = dVar34 + dVar10 * dVar26;
                piVar16 = piVar16 + 1;
              } while (piVar16 != piVar6);
            }
            if (dVar9 < 0.0) {
              local_88._8_8_ = 0;
              local_88._0_8_ = dVar33;
              local_78 = dVar34;
              dVar9 = sqrt(dVar9);
              dVar33 = local_88._0_8_;
              uVar30 = local_88._8_4_;
              uVar32 = local_88._12_4_;
              dVar34 = local_78;
            }
            else {
              dVar9 = SQRT(dVar9);
            }
            dVar34 = dVar34 / dVar9;
            dVar24 = dVar34;
            if (dVar34 <= minEfficacy) {
              dVar24 = minEfficacy;
            }
            uVar19 = CONCAT44(uVar32,uVar30) & uStack_b0;
            auVar28._0_8_ = ~-(ulong)(minEfficacy < dVar34) & local_c8._0_8_;
            auVar28._8_8_ = ~uStack_b0 & local_c8._8_8_;
            auVar12._8_4_ = (int)uVar19;
            auVar12._0_8_ = (ulong)dVar33 & -(ulong)(minEfficacy < dVar34);
            auVar12._12_4_ = (int)(uVar19 >> 0x20);
            local_c8 = auVar28 | auVar12;
            uStack_b0 = 0;
            minEfficacy = dVar24;
          }
        } while ((uVar23 < 3) && (uVar23 = uVar23 + 1, !onlyInitialCMIRScale));
      }
      piVar16 = (this->integerinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar6 = (this->integerinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (piVar16 != piVar6) {
        dVar24 = 1.0 / (double)local_c8._0_8_;
        local_d0 = local_d0 * dVar24 * dVar24;
        local_88._0_8_ = dVar24;
        do {
          iVar13 = *piVar16;
          dVar34 = minEfficacy;
          if (((this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar13] < INFINITY) &&
             (this->feastol <
              (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar13])) {
            flipComplementation(this,iVar13);
            dVar34 = ((this->rhs).hi + (this->rhs).lo) * (double)local_88._0_8_;
            dVar33 = (double)(long)((long)dVar34 - (ulong)(dVar34 < (double)(long)dVar34));
            dVar34 = dVar34 - dVar33;
            if ((0.005 <= dVar34) &&
               ((dVar34 <= 0.995 && (dVar25 = 1.0 / (1.0 - dVar34), dVar25 <= 1000000.0)))) {
              dVar33 = dVar25 * local_a8 * dVar24 - dVar33;
              piVar17 = (this->integerinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              piVar7 = (this->integerinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              dVar25 = local_d0;
              if (piVar17 != piVar7) {
                do {
                  iVar1 = *piVar17;
                  dVar10 = this->vals[iVar1] * (double)local_88._0_8_;
                  dVar9 = dVar10 + 1e-14;
                  lVar20 = (long)dVar9;
                  dVar9 = (double)(long)(lVar20 - (ulong)(dVar9 < (double)lVar20));
                  dVar10 = (dVar10 - dVar9) - dVar34;
                  if (dVar10 <= 0.0) {
                    dVar10 = 0.0;
                  }
                  dVar10 = dVar10 + dVar9;
                  dVar9 = (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start[iVar1];
                  if (((dVar10 <= 0.0) || (this->feastol < dVar9)) &&
                     ((0.0 <= dVar10 ||
                      (dVar9 < (this->upper).super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_start[iVar1] - this->feastol)))) {
                    dVar25 = dVar25 + dVar10 * dVar10;
                  }
                  dVar33 = dVar33 + dVar10 * dVar9;
                  piVar17 = piVar17 + 1;
                } while (piVar17 != piVar7);
              }
              if (dVar25 < 0.0) {
                local_78 = dVar33;
                dVar25 = sqrt(dVar25);
                dVar33 = local_78;
              }
              else {
                dVar25 = SQRT(dVar25);
              }
              dVar34 = dVar33 / dVar25;
              if (minEfficacy < dVar33 / dVar25) goto LAB_00283c3c;
            }
            flipComplementation(this,iVar13);
            dVar34 = minEfficacy;
          }
LAB_00283c3c:
          piVar16 = piVar16 + 1;
          minEfficacy = dVar34;
        } while (piVar16 != piVar6);
      }
      local_58.hi = (double)local_c8._0_8_;
      local_58.lo = 0.0;
      local_98.hi = 1.0;
      local_98.lo = 0.0;
      HighsCDouble::operator/=(&local_98,&local_58);
      local_68.hi = local_98.hi;
      local_68.lo = local_98.lo;
      HVar35 = HighsCDouble::operator*(&this->rhs,local_98.hi);
      dVar24 = (this->rhs).hi * local_68.lo;
      dVar34 = HVar35.hi + dVar24;
      dVar33 = (HVar35.hi - (dVar34 - dVar24)) + (dVar24 - (dVar34 - (dVar34 - dVar24))) + HVar35.lo
      ;
      dVar24 = floor(dVar34 + dVar33);
      uVar19 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc) ^ DAT_003c50b0._8_8_;
      local_78 = dVar34 - dVar24;
      dVar33 = ((double)((ulong)dVar24 ^ (ulong)DAT_003c50b0) - (local_78 - dVar34)) +
               (dVar34 - (local_78 - (local_78 - dVar34))) + dVar33;
      dVar34 = (double)((ulong)DAT_003c50b0 ^ (ulong)local_78);
      local_58.hi = 1.0 - local_78;
      uStack_70 = 0;
      local_48._8_4_ = DAT_003c50b0._8_4_;
      local_48._0_8_ = dVar34;
      local_48._12_4_ = DAT_003c50b0._12_4_;
      local_88._8_4_ = (int)uVar19;
      local_88._0_8_ = dVar33;
      local_88._12_4_ = (int)(uVar19 >> 0x20);
      local_58.lo = ((1.0 - (local_78 + local_58.hi)) +
                    (dVar34 - (local_58.hi - (local_78 + local_58.hi)))) - dVar33;
      local_98.hi = 1.0;
      local_98.lo = 0.0;
      HighsCDouble::operator/=(&local_98,&local_58);
      (this->rhs).hi = dVar24 * (double)local_c8._0_8_;
      (this->rhs).lo = 0.0;
      this->integralSupport = true;
      this->integralCoefficients = false;
      if (this->rowlen != 0) {
        dVar24 = local_78 + (double)local_88._0_8_;
        uVar19 = 0;
        do {
          dVar34 = this->vals[uVar19];
          if ((dVar34 != 0.0) || (NAN(dVar34))) {
            if ((this->isintegral).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar19] == '\0') {
              if (dVar34 <= 0.0) {
                HVar35 = HighsCDouble::operator*(&local_98,dVar34);
                this->vals[uVar19] = HVar35.lo + HVar35.hi;
                this->integralSupport = false;
              }
              else {
                this->vals[uVar19] = 0.0;
              }
            }
            else {
              HVar35 = HighsCDouble::operator*(&local_68,dVar34);
              dVar34 = HVar35.hi;
              dVar33 = dVar34 + 1e-14;
              dVar33 = floor((1e-14 - (dVar33 - dVar34)) + (dVar34 - (dVar33 - (dVar33 - dVar34))) +
                             HVar35.lo + dVar33);
              dVar25 = dVar34 - dVar33;
              dVar34 = (-dVar33 - (dVar25 - dVar34)) + (dVar34 - (dVar25 - (dVar25 - dVar34))) +
                       HVar35.lo;
              local_58.lo = 0.0;
              local_58.hi = dVar33;
              if (dVar24 < dVar25 + dVar34) {
                dVar10 = dVar25 - local_78;
                local_58.hi = dVar33 + dVar10;
                local_58.lo = (dVar33 - (local_58.hi - dVar10)) +
                              (dVar10 - (local_58.hi - (local_58.hi - dVar10))) + 0.0 +
                              ((dVar34 + ((double)local_48._0_8_ - (dVar10 - dVar25)) +
                                         (dVar25 - (dVar10 - (dVar10 - dVar25)))) -
                              (double)local_88._0_8_);
              }
              HVar35 = HighsCDouble::operator*(&local_58,(double)local_c8._0_8_);
              this->vals[uVar19] = HVar35.lo + HVar35.hi;
            }
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 != (uint)this->rowlen);
      }
    }
  }
  return SUB41(uVar21,0);
}

Assistant:

bool HighsCutGeneration::cmirCutGenerationHeuristic(double minEfficacy,
                                                    bool onlyInitialCMIRScale) {
  using std::abs;
  using std::floor;
  using std::max;
  using std::sqrt;

  // initialize indicators
  integralSupport = false;
  integralCoefficients = false;

  double continuouscontribution = 0.0;
  double continuoussqrnorm = 0.0;

  deltas.clear();
  deltas.reserve(rowlen + 3);
  integerinds.clear();
  integerinds.reserve(rowlen);

  double maxabsdelta = 0.0;
  constexpr double maxCMirScale = 1e6;
  constexpr double f0min = 0.005;
  constexpr double f0max = 0.995;

  complementation.resize(rowlen);

  for (HighsInt i = 0; i != rowlen; ++i) {
    if (isintegral[i]) {
      integerinds.push_back(i);

      if (upper[i] < 2 * solval[i]) flipComplementation(i);

      if (onlyInitialCMIRScale) continue;

      if (solval[i] > feastol) {
        double delta = abs(vals[i]);
        if (delta <= 1e-4 || delta == maxabsdelta) continue;
        maxabsdelta = max(maxabsdelta, delta);
        deltas.push_back(delta);
      }
    } else {
      updateViolationAndNorm(i, vals[i], continuouscontribution,
                             continuoussqrnorm);
    }
  }

  if (continuoussqrnorm == 0 && deltas.size() > 1) {
    double intScale = HighsIntegers::integralScale(deltas, feastol, kHighsTiny);

    if (intScale != 0.0 && intScale <= 1e4) {
      double scalrhs = double(rhs) * intScale;
      double downrhs = fast_floor(scalrhs);

      double f0 = scalrhs - downrhs;
      if (f0 >= f0min && f0 <= f0max) deltas.push_back(1.0 / intScale);
    }
  }

  deltas.push_back(std::min(1.0, initialScale));
  if (!onlyInitialCMIRScale)
    deltas.push_back(maxabsdelta + std::min(1.0, initialScale));

  if (deltas.empty()) return false;

  pdqsort(deltas.begin(), deltas.end());
  double curdelta = deltas[0];
  for (size_t i = 1; i < deltas.size(); ++i) {
    if (deltas[i] - curdelta <= 10 * feastol)
      deltas[i] = 0.0;
    else
      curdelta = deltas[i];
  }

  deltas.erase(std::remove(deltas.begin(), deltas.end(), 0.0), deltas.end());
  double bestdelta = -1;
  double bestefficacy = minEfficacy;

  for (double delta : deltas) {
    double scale = 1.0 / delta;
    double scalrhs = double(rhs) * scale;
    double downrhs = fast_floor(scalrhs);

    double f0 = scalrhs - downrhs;
    if (f0 < f0min || f0 > f0max) continue;
    double oneoveroneminusf0 = 1.0 / (1.0 - f0);
    if (oneoveroneminusf0 > maxCMirScale) continue;

    double sqrnorm = scale * scale * continuoussqrnorm;
    double viol = scale * continuouscontribution * oneoveroneminusf0 - downrhs;

    for (HighsInt j : integerinds) {
      double scalaj = vals[j] * scale;
      double downaj = fast_floor(scalaj + kHighsTiny);
      double fj = scalaj - downaj;
      double aj = downaj + std::max(0.0, fj - f0);
      updateViolationAndNorm(j, aj, viol, sqrnorm);
    }

    double efficacy = viol / sqrt(sqrnorm);
    if (efficacy > bestefficacy) {
      bestdelta = delta;
      bestefficacy = efficacy;
    }
  }

  if (bestdelta == -1) return false;

  /* try if multiplying best delta by 2 4 or 8 gives a better efficacy */
  for (HighsInt k = 1; !onlyInitialCMIRScale && k <= 3; ++k) {
    double delta = bestdelta * (1 << k);
    double scale = 1.0 / delta;
    double scalrhs = double(rhs) * scale;
    double downrhs = fast_floor(scalrhs);
    double f0 = scalrhs - downrhs;
    if (f0 < f0min || f0 > f0max) continue;

    double oneoveroneminusf0 = 1.0 / (1.0 - f0);
    if (oneoveroneminusf0 > maxCMirScale) continue;

    double sqrnorm = scale * scale * continuoussqrnorm;
    double viol = scale * continuouscontribution * oneoveroneminusf0 - downrhs;

    for (HighsInt j : integerinds) {
      double scalaj = vals[j] * scale;
      double downaj = fast_floor(scalaj + kHighsTiny);
      double fj = scalaj - downaj;
      double aj = downaj + std::max(0.0, fj - f0);
      updateViolationAndNorm(j, aj, viol, sqrnorm);
    }

    double efficacy = viol / sqrt(sqrnorm);
    if (efficacy > bestefficacy) {
      bestdelta = delta;
      bestefficacy = efficacy;
    }
  }

  assert(bestdelta != -1);

  // try to flip complementation of integers to increase efficacy
  for (HighsInt k : integerinds) {
    if (upper[k] == kHighsInf) continue;
    if (solval[k] <= feastol) continue;

    flipComplementation(k);

    double delta = bestdelta;
    double scale = 1.0 / delta;
    double scalrhs = double(rhs) * scale;
    double downrhs = fast_floor(scalrhs);

    double f0 = scalrhs - downrhs;
    if (f0 < f0min || f0 > f0max) {
      flipComplementation(k);
      continue;
    }

    double oneoveroneminusf0 = 1.0 / (1.0 - f0);
    if (oneoveroneminusf0 > maxCMirScale) {
      flipComplementation(k);
      continue;
    }

    double sqrnorm = scale * scale * continuoussqrnorm;
    double viol = scale * continuouscontribution * oneoveroneminusf0 - downrhs;

    for (HighsInt j : integerinds) {
      double scalaj = vals[j] * scale;
      double downaj = fast_floor(scalaj + kHighsTiny);
      double fj = scalaj - downaj;
      double aj = downaj + std::max(0.0, fj - f0);
      updateViolationAndNorm(j, aj, viol, sqrnorm);
    }

    double efficacy = viol / sqrt(sqrnorm);
    if (efficacy > bestefficacy) {
      bestefficacy = efficacy;
    } else {
      flipComplementation(k);
    }
  }

  HighsCDouble scale = 1.0 / HighsCDouble(bestdelta);
  HighsCDouble scalrhs = rhs * scale;
  double downrhs = floor(double(scalrhs));

  HighsCDouble f0 = scalrhs - downrhs;
  HighsCDouble oneoveroneminusf0 = 1.0 / (1.0 - f0);

  rhs = downrhs * bestdelta;
  integralSupport = true;
  integralCoefficients = false;
  for (HighsInt j = 0; j != rowlen; ++j) {
    if (vals[j] == 0.0) continue;
    if (!isintegral[j]) {
      if (vals[j] > 0.0)
        vals[j] = 0.0;
      else {
        vals[j] = double(vals[j] * oneoveroneminusf0);
        integralSupport = false;
      }
    } else {
      HighsCDouble scalaj = scale * vals[j];
      double downaj = floor(double(scalaj + kHighsTiny));
      HighsCDouble fj = scalaj - downaj;
      HighsCDouble aj = downaj;
      if (fj > f0) aj += fj - f0;

      vals[j] = double(aj * bestdelta);
    }
  }

  return true;
}